

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubf1.c
# Opt level: O2

LispPTR N_OP_ubfloat1(LispPTR arg,int alpha)

{
  uint type;
  ushort uVar1;
  LispPTR LVar2;
  uint *NAddr;
  LispPTR *pLVar3;
  
  switch(alpha) {
  case 0:
    type = 3;
    break;
  case 1:
    if ((arg & 0xfff0000) == 0xf0000) {
      return (LispPTR)(float)(int)(arg | 0xffff0000);
    }
    if ((arg & 0xfff0000) == 0xe0000) {
      return (LispPTR)(float)(arg & 0xffff);
    }
    uVar1 = *(ushort *)((ulong)(arg >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
    if (uVar1 == 2) {
      pLVar3 = NativeAligned4FromLAddr(arg);
      return (LispPTR)(float)(int)*pLVar3;
    }
    if (uVar1 != 3) {
      MachineState.tosvalue = arg;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar3 = NativeAligned4FromLAddr(arg);
    return *pLVar3;
  case 2:
    return arg & 0x7fffffff;
  case 3:
    return arg + 0x80000000;
  case 4:
    if ((float)arg != 2.1474836e+09) {
      MachineState.tosvalue = arg;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    arg = (LispPTR)(float)arg;
    if ((arg & 0xffff0000) == 0xffff0000) {
      return arg & 0xffff | 0xf0000;
    }
    if ((arg & 0xffff0000) == 0) {
      return arg | 0xe0000;
    }
    type = 2;
    break;
  default:
    MachineState.errorexit = 1;
    MachineState.tosvalue = arg;
    return 0xffffffff;
  }
  NAddr = (uint *)createcell68k(type);
  *NAddr = arg;
  LVar2 = LAddrFromNative(NAddr);
  return LVar2;
}

Assistant:

LispPTR N_OP_ubfloat1(LispPTR arg, int alpha) {
  switch (alpha) {
    case 0: /* box */
    {
      LispPTR *wordp;
      wordp = createcell68k(TYPE_FLOATP);
      *wordp = arg;
      return (LAddrFromNative(wordp));
    }
    case 1: /* unbox */
    {
      float dest;
      LispPTR ret;
      N_MakeFloat(arg, dest, arg);
      ret = *(LispPTR *)&dest;
      return (ret);
    }
    case 2: /* abs */ return (0x7FFFFFFF & arg);
    case 3: /* neg */ return (0x80000000 ^ arg);
    case 4: /* ufix */
    {
      float temp;
      int val;
      temp = *(float *)&arg;
      if ((temp > ((float)0x7fffffff)) || (temp < ((float)0x80000000))) ERROR_EXIT(arg);
      val = (int)temp;
      N_ARITH_SWITCH(val);
    }
    default: ERROR_EXIT(arg);
  } /* end switch */
}